

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socketio_berkeley.c
# Opt level: O0

void strtoup(char *str)

{
  int iVar1;
  ushort **ppuVar2;
  char *local_10;
  char *str_local;
  
  local_10 = str;
  if (str != (char *)0x0) {
    for (; *local_10 != '\0'; local_10 = local_10 + 1) {
      ppuVar2 = __ctype_b_loc();
      if ((((*ppuVar2)[(int)*local_10] & 0x400) != 0) &&
         (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)*local_10] & 0x200) != 0)) {
        iVar1 = toupper((int)*local_10);
        *local_10 = (char)iVar1;
      }
    }
  }
  return;
}

Assistant:

static void strtoup(char* str)
{
    if (str != NULL)
    {
        while (*str != '\0')
        {
            if (isalpha((int)*str) && islower((int)*str))
            {
                *str = (char)toupper((int)*str);
            }
            str++;
        }
    }
}